

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O2

int __thiscall
CAPSFile::DecompressData
          (CAPSFile *this,IDisk *disk,uint ctype,uint cyl,uint head,DataChunks imageItem)

{
  uint density_buf_size;
  uint track_buf_size;
  uint ctype_00;
  CAPSFile *this_00;
  uint ctype_01;
  uint in_R9D;
  
  ctype_00 = cyl;
  density_buf_size = ExtractInt(imageItem.buffer);
  this_00 = (CAPSFile *)(imageItem.buffer + 4);
  track_buf_size = ExtractInt((uchar *)this_00);
  ctype_01 = cyl;
  ExtractDensity(this_00,imageItem.buffer + 8,density_buf_size,ctype_00,cyl,in_R9D);
  ExtractTrack(this_00,disk,imageItem.buffer + (long)(int)density_buf_size + 8,track_buf_size,
               ctype_01,cyl,head);
  return 0;
}

Assistant:

int CAPSFile::DecompressData(IDisk* disk, DWORD ctype, DWORD cyl, DWORD head, DataChunks imageItem)
{
   // Get the DATA buffer :

   // First PACK size
   int offset = 0;
   int density_buf_size = ExtractInt(&imageItem.buffer[offset]);
   offset += 4;
   // Second PACK size
   int track_buf_size = ExtractInt(&imageItem.buffer[offset]);
   offset += 4;

   // First pack is density information
   ExtractDensity(&imageItem.buffer[offset], density_buf_size, ctype, cyl, head);
   offset += density_buf_size;

   // Second one is track informations
   ExtractTrack(disk, &imageItem.buffer[offset], track_buf_size, ctype, cyl, head);

   return 0;
}